

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsThermalEngine.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsThermalEngine::ArchiveOUT(ChShaftsThermalEngine *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsThermalEngine>(marchive);
  ChShaftsTorqueBase::ArchiveOUT(&this->super_ChShaftsTorqueBase,marchive);
  local_30._value = &this->Tw;
  local_30._name = "Tw";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->throttle;
  local_48._name = "throttle";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChShaftsThermalEngine::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsThermalEngine>();

    // serialize parent class
    ChShaftsTorqueBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(Tw);
    marchive << CHNVP(throttle);
}